

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::softmax_all_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *a;
  tensor *in_RDI;
  operation_mode in_stack_000000ec;
  tensor *in_stack_000000f0;
  ostringstream dlib_o_out_1;
  tensor *in_stack_00000100;
  long in_stack_00000108;
  long in_stack_00000110;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffbe0;
  tensor *in_stack_fffffffffffffbe8;
  error_type eVar5;
  tensor *in_stack_fffffffffffffbf0;
  ostringstream local_340 [383];
  undefined1 local_1c1;
  ostringstream local_190 [392];
  tensor *local_8;
  
  local_8 = in_RDI;
  bVar1 = have_same_dimensions(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  if (!bVar1) {
    dlib_assert_breakpoint();
    eVar5 = (error_type)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x713);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_190,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_190,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::softmax_all_gradient(tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_190,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"have_same_dimensions(grad,dest)");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    local_1c1 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffffbf0,eVar5,in_stack_fffffffffffffbe0);
    local_1c1 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  bVar1 = have_same_dimensions(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  if (!bVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar2 = std::operator<<((ostream *)local_340,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x714);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_340,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_340,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::softmax_all_gradient(tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_340,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"have_same_dimensions(grad,gradient_input)");
    std::operator<<(poVar2,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(local_340,std::boolalpha);
    a = (string *)std::operator<<(poVar4,"");
    eVar5 = (error_type)((ulong)poVar4 >> 0x20);
    std::operator<<((ostream *)a,"\n");
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,eVar5,a);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  tensor::nr(local_8);
  tensor::nc(local_8);
  tensor::k(local_8);
  ttimpl::softmax_gradient
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,_dlib_o_out_1,in_stack_000000f0,
             in_stack_000000ec);
  return;
}

Assistant:

void softmax_all_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(have_same_dimensions(grad,dest));
            DLIB_CASSERT(have_same_dimensions(grad,gradient_input));
            ttimpl::softmax_gradient(1, grad.nr()*grad.nc()*grad.k(), grad, dest, gradient_input);
        }